

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flv.c
# Opt level: O3

int flvtag_amfcaption_utf8(flvtag_t *tag,uint32_t timestamp,utf8_char_t *text)

{
  uint8_t *puVar1;
  uint8_t *__ptr;
  size_t sVar2;
  size_t sVar3;
  size_t __n;
  
  __ptr = (uint8_t *)malloc(0x80f);
  tag->data = __ptr;
  tag->aloc = 0x80f;
  __ptr[4] = (uint8_t)(timestamp >> 0x10);
  __ptr[5] = (uint8_t)(timestamp >> 8);
  __ptr[6] = (uint8_t)timestamp;
  __ptr[7] = (uint8_t)(timestamp >> 0x18);
  __ptr[0] = '\x12';
  __ptr[1] = '\0';
  __ptr[2] = '\0';
  __ptr[3] = '\0';
  __ptr[0xc] = '\0';
  __ptr[0xd] = '\0';
  __ptr[8] = '\0';
  __ptr[9] = '\0';
  __ptr[10] = '\0';
  __ptr[0xb] = '\0';
  __ptr[0xe] = '\v';
  sVar2 = strlen(text);
  __n = 0x10064;
  if (sVar2 < 0x10064) {
    __n = sVar2;
  }
  if (0x7d2 < sVar2) {
    __ptr = (uint8_t *)realloc(__ptr,__n + 0x3d);
    tag->data = __ptr;
    tag->aloc = __n + 0x3d;
  }
  sVar3 = flvtag_header_size(tag);
  puVar1 = __ptr + sVar3;
  puVar1[0] = '\x02';
  puVar1[1] = '\0';
  puVar1[2] = '\r';
  puVar1[3] = 'o';
  puVar1[4] = 'n';
  puVar1[5] = 'C';
  puVar1[6] = 'a';
  puVar1[7] = 'p';
  puVar1[8] = 't';
  puVar1[9] = 'i';
  puVar1[10] = 'o';
  puVar1[0xb] = 'n';
  puVar1[0xc] = 'I';
  puVar1[0xd] = 'n';
  puVar1[0xe] = 'f';
  puVar1[0xf] = 'o';
  puVar1 = __ptr + sVar3 + 0x10;
  puVar1[0] = '\b';
  puVar1[1] = '\0';
  puVar1[2] = '\0';
  puVar1[3] = '\0';
  puVar1[4] = '\x02';
  puVar1[5] = '\0';
  puVar1[6] = '\x04';
  puVar1[7] = 't';
  puVar1[8] = 'y';
  puVar1[9] = 'p';
  puVar1[10] = 'e';
  puVar1[0xb] = '\x02';
  puVar1[0xc] = '\0';
  puVar1[0xd] = '\x04';
  puVar1[0xe] = 'U';
  puVar1[0xf] = 'T';
  puVar1 = __ptr + sVar3 + 0x1b;
  puVar1[0] = '\x02';
  puVar1[1] = '\0';
  puVar1[2] = '\x04';
  puVar1[3] = 'U';
  puVar1[4] = 'T';
  puVar1[5] = 'F';
  puVar1[6] = '8';
  puVar1[7] = '\0';
  puVar1[8] = '\x04';
  puVar1[9] = 'd';
  puVar1[10] = 'a';
  puVar1[0xb] = 't';
  puVar1[0xc] = 'a';
  puVar1[0xd] = '\x02';
  puVar1[0xe] = '\0';
  puVar1[0xf] = '\0';
  sVar3 = flvtag_header_size(tag);
  memcpy(__ptr + sVar3 + 0x2a,text,__n);
  *(ushort *)(__ptr + sVar3 + 0x28) = (ushort)__n << 8 | (ushort)__n >> 8;
  (__ptr + __n + 0x2a + sVar3)[0] = '\0';
  (__ptr + __n + 0x2a + sVar3)[1] = '\0';
  __ptr[__n + 0x2c + sVar3] = '\t';
  flvtag_updatesize(tag,(int)__n + 0x2e);
  return 1;
}

Assistant:

int flvtag_amfcaption_utf8(flvtag_t* tag, uint32_t timestamp, const utf8_char_t* text)
{
    flvtag_initamf(tag, timestamp);
    unsigned long size = strlen(text);

    if (MAX_AMF_STRING < size) {
        size = MAX_AMF_STRING;
    }

    flvtag_reserve(tag, sizeof(onCaptionInfoUTF8) + size + 3);
    memcpy(flvtag_payload_data(tag), onCaptionInfoUTF8, sizeof(onCaptionInfoUTF8));
    uint8_t* data = flvtag_payload_data(tag) + sizeof(onCaptionInfo708);
    memcpy(data, text, size);
    // Update the size of the string
    data[-2] = size >> 8;
    data[-1] = size >> 0;
    // write the last array element
    data[size + 0] = 0x00;
    data[size + 1] = 0x00;
    data[size + 2] = 0x09;
    flvtag_updatesize(tag, sizeof(onCaptionInfoUTF8) + size + 3);

    return 1;
}